

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void tqapi_tapi_free_query_positions_result(TradeApi *tapi,QueryPositionsResult *result)

{
  QueryPositionsResultData *this;
  QueryPositionsResult *result_local;
  TradeApi *tapi_local;
  
  this = result->_data;
  if (this != (QueryPositionsResultData *)0x0) {
    QueryPositionsResultData::~QueryPositionsResultData(this);
    operator_delete(this);
  }
  if (result != (QueryPositionsResult *)0x0) {
    operator_delete(result);
  }
  return;
}

Assistant:

void tqapi_tapi_free_query_positions_result (TradeApi* tapi, QueryPositionsResult* result)
    {
        delete result->_data;
        delete result;
    }